

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::SocketAcceptor::onConnect
          (SocketAcceptor *this,SocketServer *server,socket_handle a,socket_handle s)

{
  NullLog *pNVar1;
  socket_handle s_00;
  bool bVar2;
  iterator iVar3;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  *__x;
  SocketConnection *this_00;
  mapped_type *ppSVar4;
  ostream *poVar5;
  char *pcVar6;
  NullLog *pNVar7;
  int port;
  Sessions sessions;
  stringstream stream;
  socket_handle local_240;
  int local_23c;
  string local_238 [32];
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_218;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_240 = s;
  bVar2 = socket_isValid(s);
  if (bVar2) {
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
            ::find(&(this->m_connections)._M_t,&local_240);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->m_connections)._M_t._M_impl.super__Rb_tree_header) {
      local_23c = SocketServer::socketToPort(server,a);
      __x = &std::
             map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
             ::operator[](&this->m_portToSessions,&local_23c)->_M_t;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_1e8,__x);
      this_00 = (SocketConnection *)operator_new(0x2180);
      s_00 = local_240;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::_Rb_tree(&local_218,&local_1e8);
      SocketConnection::SocketConnection(this_00,s_00,(Sessions *)&local_218,&server->m_monitor);
      ppSVar4 = std::
                map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
                ::operator[](&this->m_connections,&local_240);
      *ppSVar4 = this_00;
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_218);
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar5 = std::operator<<(local_1a8,"Accepted connection from ");
      pcVar6 = socket_peername(local_240);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5," on port ");
      std::ostream::operator<<((ostream *)poVar5,local_23c);
      pNVar1 = (NullLog *)(this->super_Acceptor).m_pLog;
      std::__cxx11::stringbuf::str();
      pNVar7 = &(this->super_Acceptor).m_nullLog;
      if (pNVar1 != (NullLog *)0x0) {
        pNVar7 = pNVar1;
      }
      (*(pNVar7->super_Log)._vptr_Log[6])(pNVar7,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_1e8);
    }
  }
  return;
}

Assistant:

void SocketAcceptor::onConnect( SocketServer& server, socket_handle a, socket_handle s )
{
  if ( !socket_isValid( s ) ) return;
  SocketConnections::iterator i = m_connections.find( s );
  if ( i != m_connections.end() ) return;
  int port = server.socketToPort( a );
  Sessions sessions = m_portToSessions[port];
  m_connections[ s ] = new SocketConnection( s, sessions, &server.getMonitor() );

  std::stringstream stream;
  stream << "Accepted connection from " << socket_peername( s ) << " on port " << port;

  if( getLog() )
    getLog()->onEvent( stream.str() );
}